

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  
  pTVar2 = index2value(L,idx);
  iVar1 = luaH_next(L,(Table *)(pTVar2->value_).gc,(StkId)((L->top).offset + -0x10));
  (L->top).p = (L->top).p + (ulong)(iVar1 != 0) * 2 + -1;
  return iVar1;
}

Assistant:

LUA_API int lua_next (lua_State *L, int idx) {
  Table *t;
  int more;
  lua_lock(L);
  api_checkpop(L, 1);
  t = gettable(L, idx);
  more = luaH_next(L, t, L->top.p - 1);
  if (more)
    api_incr_top(L);
  else  /* no more elements */
    L->top.p--;  /* pop key */
  lua_unlock(L);
  return more;
}